

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O1

int UTF8ToUnicode(LPCSTR lpSrcStr,int cchSrc,LPWSTR lpDestStr,int cchDest,DWORD dwFlags)

{
  int iVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  DWORD dwErrCode;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  
  if (cchSrc == 0) {
    bVar12 = false;
    iVar1 = 0;
    goto LAB_00335797;
  }
  bVar12 = false;
  uVar9 = 0;
  iVar1 = 0;
  iVar4 = 0;
LAB_003355d4:
  iVar6 = cchSrc + -1;
  bVar3 = *lpSrcStr;
  if ((char)bVar3 < '\0') {
    if ((bVar3 & 0x40) != 0) {
      if (iVar4 < 1) {
        iVar8 = -1;
        bVar2 = bVar3;
        do {
          iVar7 = iVar8;
          bVar2 = bVar2 * '\x02';
          iVar8 = iVar7 + 1;
        } while ((char)bVar2 < '\0');
        iVar4 = 0;
        if (iVar8 == 3) {
          if (iVar6 < 3) {
            iVar4 = 4;
          }
          else if (((CONCAT11(bVar3,((byte *)lpSrcStr)[1]) & 0x730) != 0) &&
                  (bVar10 = (bVar3 & 4) == 0,
                  bVar11 = (CONCAT11(bVar3,((byte *)lpSrcStr)[1]) & 0x330) == 0,
                  iVar4 = (uint)(bVar11 || bVar10) * 4, bVar11 || bVar10)) {
            bVar12 = true;
          }
        }
        else if (iVar8 == 2) {
          iVar4 = 3;
          if ((1 < iVar6) && ((bVar3 & 0xf) == 0)) {
            bVar3 = (((byte *)lpSrcStr)[1] & 0x20) >> 5;
            iVar4 = (uint)bVar3 + (uint)bVar3 * 2;
          }
        }
        else {
          iVar4 = 0;
          if (iVar8 == 1) {
            iVar4 = (uint)((bVar3 & 0x1e) != 0) * 2;
          }
        }
        if (iVar4 == 0) {
          if ((dwFlags & 8) != 0) goto LAB_003357bd;
          iVar4 = 0;
        }
        else {
          iVar4 = iVar4 + -1;
          uVar9 = (uint)(bVar2 >> ((char)iVar7 + 2U & 0x1f));
        }
      }
      else {
        if ((dwFlags & 8) != 0) {
LAB_003357bd:
          dwErrCode = 0x459;
          goto LAB_003357c2;
        }
        lpSrcStr = (LPCSTR)((byte *)lpSrcStr + -1);
        iVar4 = 0;
        bVar12 = false;
        iVar6 = cchSrc;
      }
      goto LAB_003355ff;
    }
    if (iVar4 == 0) {
      if ((dwFlags & 8) != 0) goto LAB_003357bd;
    }
    else {
      uVar5 = uVar9 * 0x40;
      uVar9 = bVar3 & 0x3f | uVar5;
      iVar4 = iVar4 + -1;
      if (iVar4 != 0) goto LAB_003355ff;
      if (bVar12) {
        if (cchDest != 0) {
          if (cchDest <= iVar1 + 1) {
LAB_003357b6:
            dwErrCode = 0x7a;
            goto LAB_003357c2;
          }
          lpDestStr[iVar1] = (short)(uVar5 + 0x3ff0000 >> 10) + L'\xd800';
          lpDestStr[iVar1 + 1] = (ushort)(bVar3 & 0x3f) | (ushort)uVar5 & 0x3ff | 0xdc00;
        }
        iVar1 = iVar1 + 2;
        goto LAB_003355fc;
      }
      if (cchDest != 0) {
        if (cchDest <= iVar1) goto LAB_003357b6;
        lpDestStr[iVar1] = (WCHAR)uVar9;
      }
      iVar1 = iVar1 + 1;
    }
  }
  else {
    if (cchDest != 0) {
      if (cchDest <= iVar1) goto LAB_003357b6;
      lpDestStr[iVar1] = (short)(char)bVar3;
    }
    iVar1 = iVar1 + 1;
  }
LAB_003355fc:
  iVar4 = 0;
  bVar12 = false;
LAB_003355ff:
  lpSrcStr = (LPCSTR)((byte *)lpSrcStr + 1);
  cchSrc = iVar6;
  if (iVar6 == 0) goto LAB_0033578c;
  goto LAB_003355d4;
LAB_0033578c:
  bVar12 = iVar4 != 0;
LAB_00335797:
  dwErrCode = 0x459;
  if ((byte)(iVar1 == 0 | (byte)((dwFlags & 8) >> 3) & bVar12) == 1) {
LAB_003357c2:
    SetLastError(dwErrCode);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int UTF8ToUnicode(
    LPCSTR lpSrcStr,
    int cchSrc,
    LPWSTR lpDestStr,
    int cchDest,
    DWORD dwFlags
    )
{
    int nTB = 0;                   // # trail bytes to follow
    int cchWC = 0;                 // # of Unicode code points generated
    CONST BYTE* pUTF8 = (CONST BYTE*)lpSrcStr;
    DWORD dwUnicodeChar = 0;       // Our character with room for full surrogate char
    BOOL bSurrogatePair = FALSE;   // Indicate we're collecting a surrogate pair
    BOOL bCheckInvalidBytes = (dwFlags & MB_ERR_INVALID_CHARS);
    BYTE UTF8;

    // Note that we can't test destination buffer length here because we may have to
    // iterate through thousands of broken characters which won't be output, even though
    // the buffer has no more room.
    while (cchSrc--)
    {
        //
        //  See if there are any trail bytes.
        //
        if (BIT7(*pUTF8) == 0)
        {
            //
            //  Found ASCII.
            //
            if (cchDest)
            {
                // In this function always test buffer size before using it
                if (cchWC >= cchDest)
                {
                    // Error: Buffer too small, we didn't process this character
                    SetLastError(ERROR_INSUFFICIENT_BUFFER);
                    return (0);
                }
                lpDestStr[cchWC] = (WCHAR)*pUTF8;
            }
            nTB = bSurrogatePair = 0;
            cchWC++;
        }
        else if (BIT6(*pUTF8) == 0)
        {
            //
            //  Found a trail byte.
            //  Note : Ignore the trail byte if there was no lead byte.
            //
            if (nTB != 0)
            {
                //
                //  Decrement the trail byte counter.
                //
                nTB--;

                // Add room for trail byte and add the trail byte falue
                dwUnicodeChar <<= 6;
                dwUnicodeChar |= LOWER_6_BIT(*pUTF8);

                // If we're done then we may need to store the data
                if (nTB == 0)
                {
                    if (bSurrogatePair)
                    {
                        if (cchDest)
                        {
                            if ((cchWC + 1) >= cchDest)
                            {
                                // Error: Buffer too small, we didn't process this character
                                SetLastError(ERROR_INSUFFICIENT_BUFFER);
                                return (0);
                            }                                

                            lpDestStr[cchWC]   = (WCHAR)
                                                 (((dwUnicodeChar - 0x10000) >> 10) + HIGH_SURROGATE_START);

                            lpDestStr[cchWC+1] = (WCHAR)
                                                 ((dwUnicodeChar - 0x10000)%0x400 + LOW_SURROGATE_START);
                        }

                        //
                        //  End of sequence.  Advance the output counter, turn off surrogateness
                        //
                        cchWC += 2;
                        bSurrogatePair = FALSE;
                    }
                    else
                    {
                        if (cchDest)
                        {
                            
                            if (cchWC >= cchDest)
                            {
                                // Error: Buffer too small, we didn't process this character
                                SetLastError(ERROR_INSUFFICIENT_BUFFER);
                                return (0);
                            }

                            lpDestStr[cchWC] = (WCHAR)dwUnicodeChar;
                        }

                        //
                        //  End of sequence.  Advance the output counter.
                        //
                        cchWC++;
                    }
                      
                }

            }
            else
            {
                if (bCheckInvalidBytes) 
                {
                    SetLastError(ERROR_NO_UNICODE_TRANSLATION);
                    return (0);
                }
                
                // error - not expecting a trail byte. That is, there is a trailing byte without leading byte.
                bSurrogatePair = FALSE;
            }
        }
        else
        {
            //
            //  Found a lead byte.
            //
            if (nTB > 0)
            {
                // error - A leading byte before the previous sequence is completed.
                if (bCheckInvalidBytes) 
                {
                    SetLastError(ERROR_NO_UNICODE_TRANSLATION);
                    return (0);
                }
                //
                //  Error - previous sequence not finished.
                //
                nTB = 0;
                bSurrogatePair = FALSE;
                // Put this character back so that we can start over another sequence.
                cchSrc++;
                pUTF8--;
            }
            else
            {
                //
                //  Calculate the number of bytes to follow.
                //  Look for the first 0 from left to right.
                //
                UTF8 = *pUTF8;
                while (BIT7(UTF8) != 0)
                {
                    UTF8 <<= 1;
                    nTB++;
                }

                // Recover the data from the byte
                UTF8 >>= nTB;

                //
                // Check for non-shortest form.
                // 
                switch (nTB)
                {
                    case 1:
                        nTB = 0;
                        break;
                    case 2:
                        // Make sure that bit 8 ~ bit 11 is not all zero.
                        // 110XXXXx 10xxxxxx
                        if ((*pUTF8 & 0x1e) == 0)
                        {
                            nTB = 0;
                        }
                        break;
                    case 3:
                        // Look ahead to check for non-shortest form.
                        // 1110XXXX 10Xxxxxx 10xxxxxx
                        if (cchSrc >= 2)
                        {
                            if (((*pUTF8 & 0x0f) == 0) && (*(pUTF8 + 1) & 0x20) == 0)
                            {
                                nTB = 0;
                            }
                        }
                        break;
                    case 4:                    
                        //
                        // This is a surrogate unicode pair
                        //
                        if (cchSrc >= 3)
                        {
                            WORD word = (((WORD)*pUTF8) << 8) | *(pUTF8 + 1);
                            // Look ahead to check for non-shortest form.
                            // 11110XXX 10XXxxxx 10xxxxxx 10xxxxxx                        
                            // Check if the 5 X bits are all zero.
                            // 0x0730 == 00000111 00110000
                            if ( (word & 0x0730) == 0 ||
                                  // If the 21st bit is 1, we have extra work
                                  ( (word & 0x0400) == 0x0400 &&
                                     // The 21st bit is 1.
                                     // Make sure that the resulting Unicode is within the valid surrogate range.
                                     // The 4 byte code sequence can hold up to 21 bits, and the maximum valid code point range
                                     // that Unicode (with surrogate) could represent are from U+000000 ~ U+10FFFF.
                                     // Therefore, if the 21 bit (the most significant bit) is 1, we should verify that the 17 ~ 20
                                     // bit are all zero.
                                     // I.e., in 11110XXX 10XXxxxx 10xxxxxx 10xxxxxx,
                                     // XXXXX can only be 10000.    
                                     // 0x0330 = 0000 0011 0011 0000
                                    (word & 0x0330) != 0 ) )
                            {
                                // Not shortest form
                                nTB = 0;
                            }                              
                            else
                            { 
                                // A real surrogate pair
                                bSurrogatePair = TRUE;
                            }
                        }                        
                        break;
                    default:                    
                        // 
                        // If the bits is greater than 4, this is an invalid
                        // UTF8 lead byte.
                        //
                        nTB = 0;
                        break;
                }

                if (nTB != 0) 
                {
                    //
                    //  Store the value from the first byte and decrement
                    //  the number of bytes to follow.
                    //
                    dwUnicodeChar = UTF8;
                    nTB--;
                } else 
                {
                    if (bCheckInvalidBytes) 
                    {
                        SetLastError(ERROR_NO_UNICODE_TRANSLATION);
                        return (0);
                    }
                }
            }
        }
        pUTF8++;
    }

    if ((bCheckInvalidBytes && nTB != 0) || (cchWC == 0)) 
    {
        // About (cchWC == 0):
        // Because we now throw away non-shortest form, it is possible that we generate 0 chars.
        // In this case, we have to set error to ERROR_NO_UNICODE_TRANSLATION so that we conform
        // to the spec of MultiByteToWideChar.
        SetLastError(ERROR_NO_UNICODE_TRANSLATION);
        return (0);
    }

    //
    //  Return the number of Unicode characters written.
    //
    return (cchWC);
}